

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearRegression.cpp
# Opt level: O0

string * __thiscall LinearRegression::generateParameters_abi_cxx11_(LinearRegression *this)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  reference ppAVar4;
  long in_RSI;
  LinearRegression *in_RDI;
  size_t *viewID_1;
  size_t var_1;
  string initParam;
  size_t *viewID;
  size_t var;
  size_t numOfContParameters;
  string numOfParameters;
  string constructGrad;
  string constructParam;
  string *outString;
  size_t in_stack_fffffffffffff2e8;
  undefined6 in_stack_fffffffffffff2f0;
  undefined1 in_stack_fffffffffffff2f6;
  undefined1 in_stack_fffffffffffff2f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2f8;
  undefined6 in_stack_fffffffffffff308;
  undefined1 in_stack_fffffffffffff30e;
  undefined1 in_stack_fffffffffffff30f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  LinearRegression *this_00;
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [39];
  undefined1 local_b59;
  string local_b58 [32];
  string local_b38 [32];
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  string local_9b8 [32];
  string local_998 [32];
  string local_978 [32];
  string local_958 [32];
  string local_938 [32];
  string local_918 [32];
  string local_8f8 [32];
  string local_8d8 [32];
  string local_8b8 [32];
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  string local_838 [32];
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  string local_798 [32];
  string local_778 [32];
  string local_758 [32];
  string local_738 [32];
  string local_718 [32];
  string local_6f8 [32];
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  reference local_4b8;
  ulong local_4b0;
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  reference local_148;
  ulong local_140;
  value_type local_138;
  undefined1 local_129 [40];
  undefined1 local_101 [33];
  string local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  this_00 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_stack_fffffffffffff310,
             CONCAT17(in_stack_fffffffffffff30f,
                      CONCAT16(in_stack_fffffffffffff30e,in_stack_fffffffffffff308)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_101 + 1),"",(allocator *)__lhs);
  std::allocator<char>::~allocator((allocator<char> *)local_101);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_129 + 1),"numberOfParameters = ",(allocator *)__rhs)
  ;
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  local_138 = 1;
  for (local_140 = 0; local_140 < 100; local_140 = local_140 + 1) {
    bVar2 = std::bitset<100UL>::test
                      ((bitset<100UL> *)
                       CONCAT17(in_stack_fffffffffffff2f7,
                                CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)),
                       in_stack_fffffffffffff2e8);
    if (bVar2) {
      bVar2 = std::bitset<100UL>::test
                        ((bitset<100UL> *)
                         CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)),
                         in_stack_fffffffffffff2e8);
      vVar1 = local_138;
      if (bVar2) {
        in_stack_fffffffffffff2f8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        ppAVar4 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                            ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                             (*(long *)(*(long *)(in_RSI + 200) + local_140 * 8) + 0x18),0);
        local_148 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::operator[](&(*ppAVar4)->_incoming,(size_type)in_stack_fffffffffffff2f8);
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((char *)in_stack_fffffffffffff2f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff2f7,
                                CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
        std::operator+(in_stack_fffffffffffff2f8,
                       (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                        CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0
                                                )));
        std::__cxx11::string::operator+=((string *)(local_129 + 1),local_168);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_188);
        std::__cxx11::string::~string(local_1a8);
      }
      else {
        pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0)
                            ,local_140);
        *pvVar3 = vVar1;
        local_138 = local_138 + 1;
      }
    }
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),100);
  *pvVar3 = 0;
  std::__cxx11::to_string((unsigned_long)this_00);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::__cxx11::string::operator+=((string *)(local_129 + 1),local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::string::~string(local_1e8);
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff2f7,
                          CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_3e8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_3c8);
  std::__cxx11::string::~string(local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_328);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_348);
  std::__cxx11::string::~string(local_368);
  bVar2 = std::bitset<100UL>::any((bitset<100UL> *)0x1e8d2f);
  if (bVar2) {
    offset_abi_cxx11_(this_00,(size_t)in_RDI);
    std::operator+(in_stack_fffffffffffff2f8,
                   (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                    CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
    std::__cxx11::to_string((unsigned_long)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+(in_stack_fffffffffffff2f8,
                   (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                    CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
    std::__cxx11::string::operator+=(local_208,local_428);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_4a8);
    std::__cxx11::string::~string(local_468);
    std::__cxx11::string::~string(local_488);
  }
  for (local_4b0 = 0; local_4b0 < 100; local_4b0 = local_4b0 + 1) {
    in_stack_fffffffffffff2f7 =
         std::bitset<100UL>::test
                   ((bitset<100UL> *)
                    CONCAT17(in_stack_fffffffffffff2f7,
                             CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)),
                    in_stack_fffffffffffff2e8);
    if (((bool)in_stack_fffffffffffff2f7) &&
       (in_stack_fffffffffffff2f6 =
             std::bitset<100UL>::test
                       ((bitset<100UL> *)
                        CONCAT17(in_stack_fffffffffffff2f7,
                                 CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)),
                        in_stack_fffffffffffff2e8), (bool)in_stack_fffffffffffff2f6)) {
      in_stack_fffffffffffff2e8 = 0;
      ppAVar4 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                           (*(long *)(*(long *)(in_RSI + 200) + local_4b0 * 8) + 0x18),0);
      local_4b8 = std::
                  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::operator[](&(*ppAVar4)->_incoming,in_stack_fffffffffffff2e8);
      offset_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      getAttributeName_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::string::operator+=((string *)(local_101 + 1),local_4d8);
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string(local_4f8);
      std::__cxx11::string::~string(local_558);
      std::__cxx11::string::~string(local_518);
      std::__cxx11::string::~string(local_538);
      offset_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      getAttributeName_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::string::operator+=(local_208,local_578);
      std::__cxx11::string::~string(local_578);
      std::__cxx11::string::~string(local_598);
      std::__cxx11::string::~string(local_658);
      std::__cxx11::string::~string(local_5b8);
      std::__cxx11::string::~string(local_5d8);
      std::__cxx11::string::~string(local_638);
      std::__cxx11::string::~string(local_5f8);
      std::__cxx11::string::~string(local_618);
      offset_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      offset_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      getAttributeName_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      getAttributeName_abi_cxx11_(this_00,(size_t)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      std::operator+(in_stack_fffffffffffff2f8,
                     (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                      CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0))
                    );
      std::__cxx11::string::operator+=(local_208,local_678);
      std::__cxx11::string::~string(local_678);
      std::__cxx11::string::~string(local_698);
      std::__cxx11::string::~string(local_878);
      std::__cxx11::string::~string(local_6b8);
      std::__cxx11::string::~string(local_6d8);
      std::__cxx11::string::~string(local_858);
      std::__cxx11::string::~string(local_6f8);
      std::__cxx11::string::~string(local_718);
      std::__cxx11::string::~string(local_838);
      std::__cxx11::string::~string(local_738);
      std::__cxx11::string::~string(local_758);
      std::__cxx11::string::~string(local_818);
      std::__cxx11::string::~string(local_778);
      std::__cxx11::string::~string(local_798);
      std::__cxx11::string::~string(local_7f8);
      std::__cxx11::string::~string(local_7b8);
      std::__cxx11::string::~string(local_7d8);
    }
  }
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI + 0xb0),
             *(size_type *)(in_RSI + 0xa0));
  std::__cxx11::to_string((unsigned_long)this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::__cxx11::string::operator+=(local_208,local_898);
  std::__cxx11::string::~string(local_898);
  std::__cxx11::string::~string(local_8b8);
  std::__cxx11::string::~string(local_b58);
  std::__cxx11::string::~string(local_8d8);
  std::__cxx11::string::~string(local_8f8);
  std::__cxx11::string::~string(local_b38);
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string(local_b18);
  std::__cxx11::string::~string(local_958);
  std::__cxx11::string::~string(local_978);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_998);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::string::~string(local_ad8);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::string::~string(local_a18);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_a98);
  std::__cxx11::string::~string(local_a58);
  std::__cxx11::string::~string(local_a78);
  local_b59 = 0;
  std::operator+(__lhs,__rhs);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::operator+(in_stack_fffffffffffff2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff2f7,
                          CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  offset_abi_cxx11_(this_00,(size_t)in_RDI);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  std::operator+(in_stack_fffffffffffff2f8,
                 (char *)CONCAT17(in_stack_fffffffffffff2f7,
                                  CONCAT16(in_stack_fffffffffffff2f6,in_stack_fffffffffffff2f0)));
  std::__cxx11::string::~string(local_b80);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_ba0);
  std::__cxx11::string::~string(local_bc0);
  std::__cxx11::string::~string(local_be0);
  std::__cxx11::string::~string(local_ca0);
  std::__cxx11::string::~string(local_c00);
  std::__cxx11::string::~string(local_c20);
  std::__cxx11::string::~string(local_c80);
  std::__cxx11::string::~string(local_c40);
  std::__cxx11::string::~string(local_c60);
  local_b59 = 1;
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string((string *)(local_129 + 1));
  std::__cxx11::string::~string((string *)(local_101 + 1));
  std::__cxx11::string::~string(local_30);
  return (string *)this_00;
}

Assistant:

std::string LinearRegression::generateParameters()
{
    _parameterIndex.resize(NUM_OF_VARIABLES+1);
    
    std::string constructParam = offset(1)+"size_t numberOfParameters;\n"+
        offset(1)+"double stepSize, error, *params = nullptr, *grad = nullptr, "+
        "*lambda = nullptr, *prevParams = nullptr, *prevGrad = nullptr;\n";
    
    std::string constructGrad = "";

    std::string numOfParameters = "numberOfParameters = ";
    size_t numOfContParameters = 1;
    
    // Computing the number of parameters we have
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;
        if (!_categoricalFeatures.test(var))
        {
            _parameterIndex[var] = numOfContParameters;
            ++numOfContParameters;
        }
        else
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            numOfParameters += "V"+std::to_string(viewID)+".size() + ";
        }
    }
    _parameterIndex[NUM_OF_VARIABLES] = 0;
    numOfParameters += std::to_string(numOfContParameters+1)+";\n";
    
    std::string initParam = offset(2)+numOfParameters+
        offset(2)+"params = new double[numberOfParameters];\n"+
        offset(2)+"grad = new double[numberOfParameters]();\n"+
        offset(2)+"prevParams = new double[numberOfParameters];\n"+
        offset(2)+"prevGrad = new double[numberOfParameters];\n"+
        offset(2)+"lambda = new double[numberOfParameters];\n";

    // TODO: make sure you initialize the params and grad arrays
    if (_categoricalFeatures.any()) 
        initParam += offset(2)+"size_t categIndex = "+
            std::to_string(numOfContParameters+1)+";\n";
    
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features.test(var))
            continue;

        if (_categoricalFeatures.test(var))
        {
            size_t& viewID = parameterQueries[var]->_aggregates[0]->_incoming[0].first;
            
            constructGrad += offset(1)+"std::unordered_map<int,size_t> index_"+
                getAttributeName(var)+";\n";

            initParam += offset(2)+"index_"+getAttributeName(var)+".reserve(V"+
                std::to_string(viewID)+".size());\n";
            // offset(2)+"firstindex_"+getAttributeName(var)+" = categIndex;\n";

            initParam += offset(2)+"for (V"+std::to_string(viewID)+
                "_tuple& tuple : V"+
                std::to_string(viewID)+")\n"+
                offset(3)+"index_"+getAttributeName(var)+
                "[tuple."+getAttributeName(var)+"] = categIndex++;\n";
        }
    }

    initParam += offset(2)+"for(size_t j = 0; j < numberOfParameters; ++j)\n"+
        offset(2)+"{\n"+
        offset(3)+"params[j] = ((double) (rand() % 800 + 1) - 400) / 100;\n"+
        offset(3)+"lambda[j] = 0.1;\n"+
        offset(2)+"}\n"+
        offset(2)+"params["+std::to_string(_parameterIndex[labelID])+"] = -1;\n"+
        offset(2)+"lambda[0] = 0.0;\n";
    
    std::string outString = constructParam+constructGrad+"\n"+
        offset(1)+"void initParametersGradients()\n"+
        offset(1)+"{\n"+initParam+offset(1)+"}\n";
    
    return outString;
}